

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_digest.c
# Opt level: O0

int do_cmac_prov(int iter,char *plaintext,hash_testvec *t)

{
  int iVar1;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  uint in_EDI;
  OSSL_PARAM params [2];
  EVP_MAC_CTX *ctx;
  EVP_MAC *cmac;
  size_t outsize;
  uchar out [64];
  size_t len;
  char *ciphername;
  char *local_d8;
  undefined4 local_d0;
  char *len_00;
  void *ptr;
  undefined1 auStack_b0 [48];
  long local_80;
  long local_78;
  ulong local_70;
  undefined1 local_68 [64];
  ulong local_28;
  char *local_20;
  undefined8 *local_18;
  undefined8 local_10;
  uint local_8;
  uint local_4;
  
  local_20 = (char *)0x0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  iVar1 = OBJ_sn2nid((char *)*in_RDX);
  if (iVar1 == 0x3f9) {
    local_20 = "kuznyechik-cbc";
  }
  else {
    if (iVar1 != 0x4a8) {
      return 0;
    }
    local_20 = "magma-cbc";
  }
  if (local_8 == 0) {
    printf("[CMAC(%s)] ",local_20);
  }
  local_70 = local_18[7];
  if (*(int *)(local_18 + 8) != 0) {
    local_70 = (ulong)*(int *)(local_18 + 8);
  }
  local_78 = EVP_MAC_fetch(0);
  if (local_78 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("cmac = EVP_MAC_fetch(NULL, \"CMAC\", NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x264);
  }
  local_80 = EVP_MAC_CTX_new(local_78);
  if (local_80 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_MAC_CTX_new(cmac)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x266);
  }
  local_d8 = "cipher";
  local_d0 = 4;
  ptr = (void *)0x0;
  len_00 = local_20;
  memset(auStack_b0,0,0x28);
  iVar1 = EVP_MAC_CTX_set_params(local_80,&local_d8);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MAC_CTX_set_params(ctx, params)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x26b);
  }
  iVar1 = EVP_MAC_init(local_80,local_18[5],(long)*(int *)((long)local_18 + 0x44),&local_d8);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, params)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x26c);
  }
  iVar1 = EVP_MAC_update(local_80,local_10,(long)*(int *)(local_18 + 6));
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x26d);
  }
  iVar1 = EVP_MAC_final(local_80,local_68,&local_28,0x40);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MAC_final(ctx, out, &len, sizeof(out))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x26e);
  }
  EVP_MAC_CTX_free(local_80);
  EVP_MAC_free(local_78);
  if (local_28 < local_70) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("outsize <= len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x274);
  }
  iVar1 = memcmp(local_68,(void *)local_18[3],local_70);
  if (iVar1 != 0) {
    printf("\x1b[1;31mcmac mismatch (iter %d)\x1b[m\n",(ulong)local_8);
    hexdump(ptr,(size_t)len_00);
    hexdump(ptr,(size_t)len_00);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

static int do_cmac_prov(int iter, const char *plaintext,
    const struct hash_testvec *t)
{
#if OPENSSL_VERSION_MAJOR >= 3
    char *ciphername = NULL;
    /*
     * CMAC needs CBC.
     * Convert 'mac' digest to the underlying CBC cipher.
     */
    switch (OBJ_sn2nid(t->algname)) {
    case NID_grasshopper_mac:
        ciphername = "kuznyechik-cbc";
        break;
    case NID_magma_mac:
        ciphername = "magma-cbc";
        break;
    default:
        return 0;
    }

    if (!iter)
	printf("[CMAC(%s)] ", ciphername);

    size_t len;
    unsigned char out[EVP_MAX_MD_SIZE];
    size_t outsize = t->outsize;
    if (t->truncate)
	outsize = t->truncate;

    EVP_MAC *cmac;
    T(cmac = EVP_MAC_fetch(NULL, "CMAC", NULL));
    EVP_MAC_CTX *ctx;
    T(ctx = EVP_MAC_CTX_new(cmac));
    OSSL_PARAM params[] = {
	OSSL_PARAM_utf8_string(OSSL_MAC_PARAM_CIPHER, ciphername, 0),
	OSSL_PARAM_END
    };
    T(EVP_MAC_CTX_set_params(ctx, params));
    T(EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, params));
    T(EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize));
    T(EVP_MAC_final(ctx, out, &len, sizeof(out)));
    EVP_MAC_CTX_free(ctx);
    EVP_MAC_free(cmac);

    /* CMAC provider will not respect outsize, and will output full block.
     * So, just compare until what we need. */
    T(outsize <= len);
    if (memcmp(out, t->digest, outsize) != 0) {
	printf(cRED "cmac mismatch (iter %d)" cNORM "\n", iter);
	hexdump(t->digest, outsize);
	hexdump(out, len);
	return 1;
    }
#endif
    return 0;
}